

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_command(connectdata *conn)

{
  void *pvVar1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  char *local_a0;
  char *local_88;
  byte local_62;
  byte local_61;
  undefined1 local_60 [8];
  hostname host;
  char *address;
  _Bool utf8;
  SMTP *smtp;
  Curl_easy *data;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 0x10) == 0) {
    if ((*(long *)((long)pvVar1 + 8) == 0) || (**(char **)((long)pvVar1 + 8) == '\0')) {
      local_a0 = "HELP";
    }
    else {
      local_a0 = *(char **)((long)pvVar1 + 8);
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s",local_a0);
  }
  else if ((*(long *)((long)pvVar1 + 8) == 0) || (**(char **)((long)pvVar1 + 8) == '\0')) {
    host.dispname = (char *)0x0;
    memset(local_60,0,0x20);
    CVar3 = smtp_parse_address(conn,(char *)**(undefined8 **)((long)pvVar1 + 0x10),&host.dispname,
                               (hostname *)local_60);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    local_61 = 0;
    if (((conn->proto).imapc.resptag[2] & 1U) != 0) {
      local_62 = 1;
      if (host.rawalloc == (char *)0x0) {
        _Var2 = Curl_is_ASCII_name(host.dispname);
        local_62 = 1;
        if (_Var2) {
          _Var2 = Curl_is_ASCII_name(host.encalloc);
          local_62 = _Var2 ^ 0xff;
        }
      }
      local_61 = local_62;
    }
    pcVar5 = "";
    if (host.encalloc == (char *)0x0) {
      local_88 = "";
    }
    else {
      pcVar5 = "@";
      local_88 = host.encalloc;
    }
    pcVar6 = "";
    if ((local_61 & 1) != 0) {
      pcVar6 = " SMTPUTF8";
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"VRFY %s%s%s%s",host.dispname,pcVar5,local_88,
                               pcVar6);
    Curl_free_idnconverted_hostname((hostname *)local_60);
    (*Curl_cfree)(host.dispname);
  }
  else {
    bVar7 = false;
    if (((conn->proto).imapc.resptag[2] & 1U) != 0) {
      iVar4 = strcmp(*(char **)((long)pvVar1 + 8),"EXPN");
      bVar7 = iVar4 == 0;
    }
    pcVar5 = "";
    if (bVar7) {
      pcVar5 = " SMTPUTF8";
    }
    data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s %s%s",*(undefined8 *)((long)pvVar1 + 8),
                               **(undefined8 **)((long)pvVar1 + 0x10),pcVar5);
  }
  if (data._4_4_ == CURLE_OK) {
    state(conn,SMTP_COMMAND);
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_perform_command(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;

  if(smtp->rcpt) {
    /* We notify the server we are sending UTF-8 data if a) it supports the
       SMTPUTF8 extension and b) The mailbox contains UTF-8 charaacters, in
       either the local address or host name parts. This is regardless of
       whether the host name is encoded using IDN ACE */
    bool utf8 = FALSE;

    if((!smtp->custom) || (!smtp->custom[0])) {
      char *address = NULL;
      struct hostname host = { NULL, NULL, NULL, NULL };

      /* Parse the mailbox to verify into the local address and host name
         parts, converting the host name to an IDN A-label if necessary */
      result = smtp_parse_address(conn, smtp->rcpt->data,
                                  &address, &host);
      if(result)
        return result;

      /* Establish whether we should report SMTPUTF8 to the server for this
         mailbox as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             ((host.encalloc) || (!Curl_is_ASCII_name(address)) ||
              (!Curl_is_ASCII_name(host.name)));

      /* Send the VRFY command (Note: The host name part may be absent when the
         host is a local system) */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "VRFY %s%s%s%s",
                             address,
                             host.name ? "@" : "",
                             host.name ? host.name : "",
                             utf8 ? " SMTPUTF8" : "");

      Curl_free_idnconverted_hostname(&host);
      free(address);
    }
    else {
      /* Establish whether we should report that we support SMTPUTF8 for EXPN
         commands to the server as per RFC-6531 sect. 3.1 point 6 */
      utf8 = (conn->proto.smtpc.utf8_supported) &&
             (!strcmp(smtp->custom, "EXPN"));

      /* Send the custom recipient based command such as the EXPN command */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s %s%s", smtp->custom,
                             smtp->rcpt->data,
                             utf8 ? " SMTPUTF8" : "");
    }
  }
  else
    /* Send the non-recipient based command such as HELP */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s",
                           smtp->custom && smtp->custom[0] != '\0' ?
                           smtp->custom : "HELP");

  if(!result)
    state(conn, SMTP_COMMAND);

  return result;
}